

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.cpp
# Opt level: O3

bool read_input_content(string *filename,string *input)

{
  pointer pcVar1;
  bool bVar2;
  int iVar3;
  undefined8 in_R9;
  string msg;
  ifstream f;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_240;
  long local_220;
  undefined4 uStack_218;
  int aiStack_200 [50];
  undefined8 auStack_138 [36];
  
  iVar3 = std::__cxx11::string::compare((char *)filename);
  if (iVar3 == 0) {
    pcVar1 = (input->_M_dataplus)._M_p;
    local_220 = 0;
    uStack_218 = 0xffffffff;
    std::__cxx11::string::_M_replace_dispatch<std::istreambuf_iterator<char,std::char_traits<char>>>
              ((string *)input,pcVar1,pcVar1 + input->_M_string_length,
               *(undefined8 *)(*(long *)(std::cin + -0x18) + 0x240568),0xffffffff,in_R9,0,0xffffffff
              );
LAB_0014bf74:
    bVar2 = true;
  }
  else {
    std::ifstream::ifstream((string *)&local_220);
    std::ifstream::open((string *)&local_220,(_Ios_Openmode)filename);
    if (*(int *)((long)aiStack_200 + *(long *)(local_220 + -0x18)) == 0) {
      pcVar1 = (input->_M_dataplus)._M_p;
      local_240._M_dataplus._M_p = (pointer)0x0;
      local_240._M_string_length._0_4_ = 0xffffffff;
      std::__cxx11::string::
      _M_replace_dispatch<std::istreambuf_iterator<char,std::char_traits<char>>>
                ((string *)input,pcVar1,pcVar1 + input->_M_string_length,
                 *(undefined8 *)((long)auStack_138 + *(long *)(local_220 + -0x18)),0xffffffff,in_R9,
                 0,0xffffffff);
      if (*(int *)((long)aiStack_200 + *(long *)(local_220 + -0x18)) == 0) {
        std::ifstream::~ifstream(&local_220);
        goto LAB_0014bf74;
      }
      std::operator+(&local_240,"Reading input file: ",filename);
      read_input_content();
    }
    else {
      std::operator+(&local_240,"Opening input file: ",filename);
      read_input_content();
    }
    std::ifstream::~ifstream(&local_220);
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool read_input_content(std::string filename, std::string *input)
{
    // Input file "-" tells Jsonnet to read stdin.
    if (filename == "-") {
        input->assign(std::istreambuf_iterator<char>(std::cin), std::istreambuf_iterator<char>());
    } else {
        std::ifstream f;
        f.open(filename);
        if (!f.good()) {
            std::string msg = "Opening input file: " + filename;
            perror(msg.c_str());
            return false;
        }
        input->assign(std::istreambuf_iterator<char>(f), std::istreambuf_iterator<char>());
        if (!f.good()) {
            std::string msg = "Reading input file: " + filename;
            perror(msg.c_str());
            return false;
        }
    }
    return true;
}